

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O1

void google::protobuf::internal::StringTypeHandlerBase::Delete(string *value)

{
  pointer pcVar1;
  
  if (value != (string *)0x0) {
    pcVar1 = (value->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &value->field_2) {
      operator_delete(pcVar1,(value->field_2)._M_allocated_capacity + 1);
    }
    operator_delete(value,0x20);
    return;
  }
  return;
}

Assistant:

void StringTypeHandlerBase::Delete(string* value) {
  delete value;
}